

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O0

void __thiscall
FastPForLib::FastBinaryPacking<8U>::encodeArray
          (FastBinaryPacking<8U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  uint32_t *out_00;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_R8;
  uint32_t i_1;
  uint32_t i;
  uint32_t *final;
  uint32_t Bs [4];
  uint32_t *initout;
  uint local_6c;
  uint bit;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_40;
  uint local_3c;
  uint32_t *local_20;
  long local_10;
  
  checkifdivisibleby(Bs._0_8_,final._4_4_);
  local_20 = in_RCX + 1;
  *in_RCX = (int)in_RDX;
  out_00 = (uint32_t *)(in_RSI + in_RDX * 4);
  for (local_10 = in_RSI; (uint32_t *)(local_10 + 0x80U) <= out_00; local_10 = local_10 + 0x80) {
    for (bit = 0; bit < 4; bit = bit + 1) {
      uVar1 = maxbits<unsigned_int_const*>
                        ((uint **)(local_10 + (ulong)(bit << 3) * 4),
                         (uint **)(local_10 + (ulong)((bit + 1) * 8) * 4));
      *(uint32_t *)(&stack0xffffffffffffffb8 + (ulong)bit * 4) = uVar1;
    }
    *local_20 = in_stack_ffffffffffffffb8 << 0x18 | in_stack_ffffffffffffffbc << 0x10 |
                local_40 << 8 | local_3c;
    local_20 = local_20 + 1;
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      local_20 = fastpackwithoutmask_8
                           ((uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),out_00,bit
                           );
    }
  }
  *in_R8 = (long)local_20 - (long)in_RCX >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }